

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O1

Path * __thiscall
kj::Path::evalWin32Impl
          (Path *__return_storage_ptr__,Path *this,Vector<kj::String> *parts,StringPtr path,
          bool fromApi)

{
  String *pSVar1;
  Exception *pEVar2;
  undefined8 *puVar3;
  ArrayDisposer *pAVar4;
  String *pSVar5;
  char *c;
  void *pvVar6;
  Fault FVar7;
  long lVar8;
  byte bVar9;
  ulong uVar10;
  char (*params) [3];
  size_t sVar12;
  unsigned_long i;
  char *pcVar13;
  char *pcVar14;
  char *pcVar15;
  ArrayPtr<const_char> part;
  ArrayPtr<const_char> part_00;
  StringPtr local_80;
  DebugExpression<bool> _kjCondition;
  Fault f;
  size_t sStack_60;
  Exception *local_58;
  String ownPath;
  Exception *pEVar11;
  
  local_80.content.size_ = (size_t)path.content.ptr;
  bVar9 = (byte)path.content.size_;
  ownPath.content.ptr = (char *)0x0;
  ownPath.content.size_ = 0;
  ownPath.content.disposer = (ArrayDisposer *)0x0;
  local_80.content.ptr = (char *)parts;
  if ((int)path.content.size_ == 0) {
    pcVar14 = (char *)(local_80.content.size_ + -1);
    pvVar6 = memchr(parts,0x2f,(size_t)pcVar14);
    if (pvVar6 != (void *)0x0) {
      heapString((String *)&f,(char *)parts,(size_t)pcVar14);
      ownPath.content.ptr = (char *)f.exception;
      ownPath.content.size_ = sStack_60;
      pEVar11 = (Exception *)((long)(f.exception)->trace + (sStack_60 - 0x69));
      FVar7 = f;
      if (sStack_60 == 0) {
        FVar7.exception = (Exception *)0x0;
      }
      ownPath.content.disposer = (ArrayDisposer *)local_58;
      if (sStack_60 == 0) {
        pEVar11 = (Exception *)0x0;
      }
      for (; FVar7.exception != pEVar11;
          FVar7.exception = (Exception *)((long)&((FVar7.exception)->ownFile).content.ptr + 1)) {
        if (*(char *)&((FVar7.exception)->ownFile).content.ptr == '/') {
          *(undefined1 *)&((FVar7.exception)->ownFile).content.ptr = 0x5c;
        }
      }
      local_80.content.ptr = (char *)f;
      if (sStack_60 == 0) {
        local_80.content.ptr = (char *)(Exception *)0x54bab9;
      }
      local_80.content.size_ = sStack_60 + (sStack_60 == 0);
    }
    if (bVar9 != 0) goto LAB_004e53b4;
LAB_004e53d4:
    pEVar11 = (Exception *)(local_80.content.size_ + -1);
    if ((pEVar11 < (Exception *)0x2) ||
       (*(short *)&((ArrayBuilder<kj::String> *)local_80.content.ptr)->ptr != 0x5c5c)) {
      if (pEVar11 == (Exception *)0x0) {
LAB_004e5460:
        if (((Exception *)0x2 < pEVar11) &&
           (*(char *)((long)&((ArrayBuilder<kj::String> *)local_80.content.ptr)->ptr + 2) == '\\'))
        {
LAB_004e546c:
          if ((*(char *)((long)&((ArrayBuilder<kj::String> *)local_80.content.ptr)->ptr + 1) == ':')
             && (pEVar2 = (Exception *)local_80.content.ptr,
                pcVar14 = (char *)local_80.content.size_,
                (byte)((*(byte *)&((ArrayBuilder<kj::String> *)local_80.content.ptr)->ptr & 0xdf) +
                      0xbf) < 0x1a)) goto LAB_004e553d;
        }
        _kjCondition.value = (bool)(bVar9 ^ 1);
        if (_kjCondition.value == false) {
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[39]>
                    (&f,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                     ,0x192,FAILED,"!fromApi",
                     "_kjCondition,\"parseWin32Api() requires absolute path\"",&_kjCondition,
                     (char (*) [39])"parseWin32Api() requires absolute path");
          kj::_::Debug::Fault::fatal(&f);
        }
        goto LAB_004e5609;
      }
      if (*(char *)&((ArrayBuilder<kj::String> *)local_80.content.ptr)->ptr != '\\') {
        if (pEVar11 != (Exception *)0x2) goto LAB_004e5460;
        goto LAB_004e546c;
      }
      _kjCondition.value = (bool)(bVar9 ^ 1);
      if (_kjCondition.value == false) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[39]>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                   ,0x17b,FAILED,"!fromApi",
                   "_kjCondition,\"parseWin32Api() requires absolute path\"",&_kjCondition,
                   (char (*) [39])"parseWin32Api() requires absolute path");
        kj::_::Debug::Fault::fatal(&f);
      }
      pSVar1 = (this->parts).ptr;
      lVar8 = (this->parts).size_ - (long)pSVar1;
      if (lVar8 == 0) {
LAB_004e54d3:
        if ((ulong)((lVar8 >> 3) * -0x5555555555555555) < 2) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26],kj::StringPtr&>
                    ((Fault *)&_kjCondition,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                     ,0x186,FAILED,(char *)0x0,"\"must specify drive letter\", path",
                     (char (*) [26])"must specify drive letter",&local_80);
          ArrayBuilder<kj::String>::clear((ArrayBuilder<kj::String> *)this);
          str<char_const(&)[3]>((String *)&f,(kj *)"c:",params);
          pSVar1 = (String *)(this->parts).disposer;
          if ((String *)(this->parts).size_ == pSVar1) {
            pSVar5 = (this->parts).ptr;
            sVar12 = 4;
            if (pSVar1 != pSVar5) {
              sVar12 = ((long)pSVar1 - (long)pSVar5 >> 3) * 0x5555555555555556;
            }
            Vector<kj::String>::setCapacity((Vector<kj::String> *)this,sVar12);
          }
          puVar3 = (undefined8 *)(this->parts).size_;
          *puVar3 = f.exception;
          puVar3[1] = sStack_60;
          puVar3[2] = local_58;
          f.exception = (Exception *)0x0;
          (this->parts).size_ = (size_t)(puVar3 + 3);
          kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition);
          pEVar11 = local_58;
          goto LAB_004e5609;
        }
        pcVar14 = (char *)0x2;
      }
      else {
        pEVar2 = (Exception *)(pSVar1->content).size_;
        pEVar11 = pEVar2;
        if (pEVar2 != (Exception *)0x0) {
          pEVar11 = (Exception *)(pSVar1->content).ptr;
        }
        if (((pEVar2 != (Exception *)0x3) ||
            (*(char *)((long)&((ArrayBuilder<kj::String> *)&pEVar11->ownFile)->ptr + 1) != ':')) ||
           (uVar10 = CONCAT71((int7)((ulong)pEVar11 >> 8),
                              *(char *)&((ArrayBuilder<kj::String> *)&pEVar11->ownFile)->ptr) &
                     0xffffffffffffffdf, bVar9 = (char)uVar10 + 0xbf,
           pEVar11 = (Exception *)CONCAT71((int7)(uVar10 >> 8),bVar9), 0x19 < bVar9))
        goto LAB_004e54d3;
        pcVar14 = (char *)0x1;
      }
      ArrayBuilder<kj::String>::truncate((ArrayBuilder<kj::String> *)this,pcVar14,(__off_t)pSVar1);
      goto LAB_004e5609;
    }
    pEVar2 = (Exception *)((long)&((ArrayBuilder<kj::String> *)local_80.content.ptr)->ptr + 2);
    pcVar14 = (char *)(local_80.content.size_ + -2);
  }
  else {
LAB_004e53b4:
    if (((char *)(local_80.content.size_ + -1) < &DAT_00000004) ||
       (*(int *)&((ArrayBuilder<kj::String> *)local_80.content.ptr)->ptr != 0x5c3f5c5c))
    goto LAB_004e53d4;
    pEVar2 = (Exception *)((long)&((ArrayBuilder<kj::String> *)local_80.content.ptr)->ptr + 4);
    pEVar11 = (Exception *)local_80.content.ptr;
    pcVar14 = (char *)(local_80.content.size_ + -4);
    if (((char *)0x3 < (char *)(local_80.content.size_ + -5)) &&
       (*(int *)&((ArrayBuilder<kj::String> *)&pEVar2->ownFile)->ptr == 0x5c434e55)) {
      pEVar11 = (Exception *)&((ArrayBuilder<kj::String> *)local_80.content.ptr)->pos;
      pEVar2 = pEVar11;
      pcVar14 = (char *)(local_80.content.size_ + -8);
    }
  }
LAB_004e553d:
  local_80.content.size_ = (size_t)pcVar14;
  local_80.content.ptr = (char *)pEVar2;
  ArrayBuilder<kj::String>::clear((ArrayBuilder<kj::String> *)this);
LAB_004e5609:
  pcVar14 = (char *)0x0;
  pcVar15 = (char *)(local_80.content.size_ + -1);
  if ((char *)local_80.content.size_ != (char *)0x1) {
    pcVar13 = (char *)0x0;
    do {
      if (pcVar13[(long)((void **)((long)local_80.content.ptr + 0x68) + -0xd)] == '\\') {
        part.size_ = (size_t)pEVar11;
        part.ptr = pcVar13 + -(long)pcVar14;
        evalPart(this,(Vector<kj::String> *)
                      (pcVar14 + (long)((void **)((long)local_80.content.ptr + 0x68) + -0xd)),part);
        pcVar14 = pcVar13 + 1;
      }
      pcVar13 = pcVar13 + 1;
    } while (pcVar15 != pcVar13);
  }
  part_00.ptr = (char *)(local_80.content.size_ + ~(ulong)pcVar14);
  part_00.size_ = (size_t)pEVar11;
  evalPart(this,(Vector<kj::String> *)
                (pcVar14 + (long)((void **)((long)local_80.content.ptr + 0x68) + -0xd)),part_00);
  pAVar4 = (ArrayDisposer *)(this->parts).size_;
  if (pAVar4 != (this->parts).disposer) {
    Vector<kj::String>::setCapacity
              ((Vector<kj::String> *)this,
               ((long)pAVar4 - (long)(this->parts).ptr >> 3) * -0x5555555555555555);
  }
  pSVar1 = (this->parts).ptr;
  sVar12 = (this->parts).size_;
  pSVar5 = this[1].parts.ptr;
  (this->parts).ptr = (String *)0x0;
  (this->parts).size_ = 0;
  (this->parts).disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->parts).ptr = pSVar1;
  (__return_storage_ptr__->parts).size_ = ((long)(sVar12 - (long)pSVar1) >> 3) * -0x5555555555555555
  ;
  (__return_storage_ptr__->parts).disposer = (ArrayDisposer *)pSVar5;
  if (ownPath.content.ptr != (char *)0x0) {
    (**(ownPath.content.disposer)->_vptr_ArrayDisposer)
              (ownPath.content.disposer,ownPath.content.ptr,1,ownPath.content.size_,
               ownPath.content.size_,0);
  }
  return __return_storage_ptr__;
}

Assistant:

Path Path::evalWin32Impl(Vector<String>&& parts, StringPtr path, bool fromApi) {
  // Convert all forward slashes to backslashes.
  String ownPath;
  if (!fromApi && path.findFirst('/') != kj::none) {
    ownPath = heapString(path);
    for (char& c: ownPath) {
      if (c == '/') c = '\\';
    }
    path = ownPath;
  }

  // Interpret various forms of absolute paths.
  if (fromApi && path.startsWith("\\\\?\\")) {
    path = path.slice(4);
    if (path.startsWith("UNC\\")) {
      path = path.slice(4);
    }

    // The path is absolute.
    parts.clear();
  } else if (path.startsWith("\\\\")) {
    // UNC path.
    path = path.slice(2);

    // This path is absolute. The first component is a server name.
    parts.clear();
  } else if (path.startsWith("\\")) {
    KJ_REQUIRE(!fromApi, "parseWin32Api() requires absolute path");

    // Path is relative to the current drive / network share.
    if (parts.size() >= 1 && isWin32Drive(parts[0])) {
      // Leading \ interpreted as root of current drive.
      parts.truncate(1);
    } else if (parts.size() >= 2) {
      // Leading \ interpreted as root of current network share (which is indicated by the first
      // *two* components of the path).
      parts.truncate(2);
    } else {
      KJ_FAIL_REQUIRE("must specify drive letter", path) {
        // Recover by assuming C drive.
        parts.clear();
        parts.add(kj::str("c:"));
        break;
      }
    }
  } else if ((path.size() == 2 || (path.size() > 2 && path[2] == '\\')) &&
             isWin32Drive(path.first(2))) {
    // Starts with a drive letter.
    parts.clear();
  } else {
    KJ_REQUIRE(!fromApi, "parseWin32Api() requires absolute path");
  }

  size_t partStart = 0;
  for (auto i: kj::indices(path)) {
    if (path[i] == '\\') {
      evalPart(parts, path.slice(partStart, i));
      partStart = i + 1;
    }
  }
  evalPart(parts, path.slice(partStart));

  return Path(parts.releaseAsArray(), Path::ALREADY_CHECKED);
}